

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O3

void __thiscall CaptureSummary::~CaptureSummary(CaptureSummary *this)

{
  pointer pp_Var1;
  pointer pp_Var2;
  ulong uVar3;
  
  pp_Var2 = (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pp_Var1 = (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pp_Var1 != pp_Var2) {
    uVar3 = 0;
    do {
      if (pp_Var2[uVar3] != (_capture_line *)0x0) {
        operator_delete(pp_Var2[uVar3]);
        (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3] = (_capture_line *)0x0;
        pp_Var2 = (this->summary).
                  super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pp_Var1 = (this->summary).
                  super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)pp_Var1 - (long)pp_Var2 >> 3));
  }
  if (pp_Var2 != (pointer)0x0) {
    operator_delete(pp_Var2);
    return;
  }
  return;
}

Assistant:

CaptureSummary::~CaptureSummary()
{
    for (size_t i = 0; i < summary.size(); i++)
    {
        if (summary[i] != NULL)
        {
            delete summary[i];
            summary[i] = NULL;
        }
    }
}